

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

_Bool resolve_params(SolverParams *params,SolverDescriptor *desc,SolverTypedParams *out)

{
  TypedParam *pTVar1;
  uint uVar2;
  char *pcVar3;
  FILE *pFVar4;
  _Bool _Var5;
  bool bVar6;
  int iVar7;
  SolverTypedParamsEntry *pSVar8;
  char *pcVar9;
  SolverDescriptor *pSVar10;
  ulong uVar11;
  SolverDescriptor *pSVar12;
  char **ppcVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  TypedParam t;
  char *local_80;
  TypedParam local_78;
  SolverDescriptor *local_60;
  SolverTypedParams *local_58;
  SolverParams *local_50;
  SolverDescriptor *local_48;
  char *local_40;
  char **local_38;
  
  local_50 = params;
  if (out->entries != (SolverTypedParamsEntry *)0x0) {
    stbds_hmfree_func(out->entries + -1,0x18);
    out->entries = (SolverTypedParamsEntry *)0x0;
  }
  out->entries = (SolverTypedParamsEntry *)0x0;
  local_40 = desc[1].name;
  if (local_40 == (char *)0x0) {
    iVar7 = 2;
    bVar6 = true;
  }
  else {
    pSVar10 = desc + 1;
    local_38 = &local_50->params[0].value;
    bVar6 = true;
    lVar14 = 0;
    pSVar12 = pSVar10;
    local_60 = pSVar10;
    local_58 = out;
    do {
      uVar2 = local_50->num_params;
      iVar7 = 5;
      bVar15 = 0 < (int)uVar2;
      if ((int)uVar2 < 1) {
        local_80 = (char *)0x0;
      }
      else {
        if (0xff < (int)uVar2) {
          uVar2 = 0x100;
        }
        local_80 = (char *)0x0;
        uVar11 = 1;
        ppcVar13 = local_38;
        local_48 = pSVar10;
        do {
          pcVar3 = ((anon_struct_16_2_f84e2411 *)(ppcVar13 + -1))->name;
          iVar7 = strcmp(pcVar3,local_40);
          if (iVar7 == 0) {
            if (local_80 != (char *)0x0) {
              bVar6 = false;
              fprintf(_stderr,"ERROR: parameter `%s` specified twice or more.\n",pcVar3);
              iVar7 = 8;
              pSVar10 = local_48;
              pSVar12 = local_60;
              out = local_58;
              goto LAB_00104a35;
            }
            local_80 = *ppcVar13;
          }
          bVar15 = uVar11 < uVar2;
          ppcVar13 = ppcVar13 + 2;
          bVar16 = uVar11 != uVar2;
          uVar11 = uVar11 + 1;
        } while (bVar16);
        iVar7 = 5;
        pSVar10 = local_48;
        pSVar12 = local_60;
        out = local_58;
      }
LAB_00104a35:
      pFVar4 = _stderr;
      if (!bVar15) {
        if (local_80 == (char *)0x0) {
          local_80 = pSVar10[2].name;
        }
        local_78.field_2.dval = 0.0;
        local_78.type = *(ParamType *)&pSVar10[1].name;
        if (local_80 == (char *)0x0) {
          local_78._0_8_ = (ulong)local_78.type << 0x20;
        }
        else {
          local_78.count = 1;
          pcVar3 = pSVar10->name;
          pcVar9 = param_type_as_str(local_78.type);
          fprintf(pFVar4,"%s :: Setting `%s` (%s) to value `%s`\n","resolve_params",pcVar3,pcVar9,
                  local_80);
          _Var5 = parse_solver_param_val(&local_78,local_80,*(ParamType *)&pSVar10[1].name);
          pFVar4 = _stderr;
          if (!_Var5) {
            pcVar3 = pSVar10->name;
            pcVar9 = param_type_as_str(*(ParamType *)&pSVar10[1].name);
            bVar6 = false;
            fprintf(pFVar4,"ERROR: Failed to parse param `%s=%s` required as a %s\n",pcVar3,local_80
                    ,pcVar9);
            iVar7 = 8;
            goto LAB_00104a92;
          }
        }
        pSVar8 = (SolverTypedParamsEntry *)stbds_hmput_key(out->entries,0x18,pSVar10->name,8,1);
        out->entries = pSVar8;
        pTVar1 = &pSVar8[pSVar8[-2].value.field_2.sizeval].value;
        pTVar1->count = local_78.count;
        pTVar1->type = local_78.type;
        (pTVar1->field_2).ival = (int32_t)local_78.field_2.fval;
        *(undefined4 *)((long)&pTVar1->field_2 + 4) = local_78.field_2.sizeval._4_4_;
        iVar7 = 0;
      }
LAB_00104a92:
      if (iVar7 != 0) goto LAB_00104bc9;
      lVar14 = lVar14 + 1;
      pSVar10 = pSVar12 + lVar14 * 4;
      local_40 = pSVar12[lVar14 * 4].name;
    } while (local_40 != (char *)0x0);
    iVar7 = 2;
  }
LAB_00104bc9:
  if (((iVar7 == 8) || (iVar7 == 2)) && (!bVar6)) {
    if (out->entries != (SolverTypedParamsEntry *)0x0) {
      stbds_hmfree_func(out->entries + -1,0x18);
      out->entries = (SolverTypedParamsEntry *)0x0;
    }
    out->entries = (SolverTypedParamsEntry *)0x0;
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool resolve_params(const SolverParams *params, const SolverDescriptor *desc,
                    SolverTypedParams *out) {
    solver_typed_params_destroy(out);
    bool result = true;

    for (int32_t di = 0; desc->params[di].name != 0; di++) {
        const char *value = NULL;
        for (int32_t pi = 0;
             pi < MIN(MAX_NUM_SOLVER_PARAMS, params->num_params); pi++) {
            if (0 == strcmp(params->params[pi].name, desc->params[di].name)) {
                if (value) {
                    fprintf(stderr,
                            "ERROR: parameter `%s` specified twice or more.\n",
                            params->params[pi].name);
                    result = false;
                    goto terminate;
                }
                value = params->params[pi].value;
            }
        }

        // If the user didn't specify any value get the default value from the
        // descriptor
        if (!value) {
            value = desc->params[di].default_value;
        }

        // NOTE:
        // The descriptor may not contain a default_value: therefore
        // `value` may still be NULL
        TypedParam t = {0};
        t.type = desc->params[di].type;

        if (!value) {
            t.count = 0;
        } else {
            t.count = 1;

            fprintf(stderr, "%s :: Setting `%s` (%s) to value `%s`\n", __func__,
                    desc->params[di].name,
                    param_type_as_str(desc->params[di].type), value);

            if (!parse_solver_param_val(&t, value, desc->params[di].type)) {
                fprintf(
                    stderr,
                    "ERROR: Failed to parse param `%s=%s` required as a %s\n",
                    desc->params[di].name, value,
                    param_type_as_str(desc->params[di].type));
                result = false;
                goto terminate;
            }
        }

        shput(out->entries, desc->params[di].name, t);
    }

terminate:
    if (!result) {
        solver_typed_params_destroy(out);
    }
    return result;
}